

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O2

void __thiscall
boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::setup
          (mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *this)

{
  uint64_t uVar1;
  __pid_t _Var2;
  pthread_t pt;
  u_int64_t uVar3;
  ulong uVar4;
  int ii_2;
  int iVar5;
  int ii;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  
  pthread_mutex_init((pthread_mutex_t *)&this->_mutex,(pthread_mutexattr_t *)0x0);
  _Var2 = getpid();
  pt = pthread_self();
  uVar3 = printPt(pt);
  this->_pid = (int)uVar3 + _Var2;
  this->_cptTotalProcessed = 0;
  if (this->_fastmode == true) {
    dVar11 = (((double)CONCAT44(0x45300000,(int)(this->_nelem >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->_nelem) - 4503599627370496.0)) *
             (double)this->_percent_elem_loaded_for_fastMode;
    uVar4 = (ulong)dVar11;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->setLevelFastmode,
               (long)(dVar11 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->bufferperThread,(long)this->_num_thread);
  if (this->_writeEachLevel == true) {
    lVar8 = 0;
    for (lVar6 = 0; lVar6 < this->_num_thread; lVar6 = lVar6 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(((this->bufferperThread).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data + lVar8),10000);
      lVar8 = lVar8 + 0x18;
    }
  }
  uVar1 = this->_nelem;
  auVar9._8_4_ = (int)(uVar1 >> 0x20);
  auVar9._0_8_ = uVar1;
  auVar9._12_4_ = 0x45300000;
  dVar11 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * this->_gamma;
  lVar6 = uVar1 - 1;
  auVar12._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar12._0_8_ = lVar6;
  auVar12._12_4_ = 0x45300000;
  dVar11 = pow((dVar11 + -1.0) / dVar11,
               (auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  this->_proba_collision = 1.0 - dVar11;
  this->_nb_levels = 0x19;
  std::vector<boomphf::level,_std::allocator<boomphf::level>_>::resize(&this->_levels,0x19);
  lVar7 = 0;
  lVar8 = 0;
  for (lVar6 = 0; uVar4 = (ulong)this->_nb_levels, lVar6 < (long)uVar4; lVar6 = lVar6 + 1) {
    *(long *)((long)&((this->_levels).
                      super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                      super__Vector_impl_data._M_start)->idx_begin + lVar7) = lVar8;
    auVar10._0_8_ = (double)CONCAT44(0x43300000,(int)this->_hash_domain);
    auVar10._8_4_ = (int)(this->_hash_domain >> 0x20);
    auVar10._12_4_ = 0x45300000;
    dVar11 = pow(this->_proba_collision,(double)(int)lVar6);
    dVar11 = dVar11 * ((auVar10._8_8_ - 1.9342813113834067e+25) +
                      (auVar10._0_8_ - 4503599627370496.0));
    uVar4 = (ulong)dVar11;
    uVar4 = ((long)(dVar11 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4) + 0x3f &
            0xffffffffffffffc0;
    if (uVar4 == 0) {
      uVar4 = 0x40;
    }
    *(ulong *)((long)&((this->_levels).
                       super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                       super__Vector_impl_data._M_start)->hash_domain + lVar7) = uVar4;
    lVar8 = lVar8 + uVar4;
    lVar7 = lVar7 + 0x40;
  }
  iVar5 = 0;
  while( true ) {
    if ((int)uVar4 <= iVar5) {
      return;
    }
    dVar11 = pow(this->_proba_collision,(double)iVar5);
    if (dVar11 < (double)this->_percent_elem_loaded_for_fastMode) break;
    iVar5 = iVar5 + 1;
    uVar4 = (ulong)(uint)this->_nb_levels;
  }
  this->_fastModeLevel = iVar5;
  return;
}

Assistant:

void setup()
		{
			pthread_mutex_init(&_mutex, NULL);

			_pid = getpid() + printPt(pthread_self()) ;// + pthread_self();
			//printf("pt self %llu  pid %i \n",printPt(pthread_self()),_pid);

			_cptTotalProcessed=0;

			
			if(_fastmode)
			{
				setLevelFastmode.resize(_percent_elem_loaded_for_fastMode * (double)_nelem );
			}

			
			bufferperThread.resize(_num_thread);
			if(_writeEachLevel)
			{
				for(int ii=0; ii<_num_thread; ii++)
				{
					bufferperThread[ii].resize(NBBUFF);
				}
			}
			
			_proba_collision = 1.0 -  pow(((_gamma*(double)_nelem -1 ) / (_gamma*(double)_nelem)),_nelem-1);

			double sum_geom =_gamma * ( 1.0 +  _proba_collision / (1.0 - _proba_collision));
			//printf("proba collision %f  sum_geom  %f   \n",_proba_collision,sum_geom);

			_nb_levels = 25;
			_levels.resize(_nb_levels);

			//build levels
			uint64_t previous_idx =0;
			for(int ii=0; ii<_nb_levels; ii++)
			{

				_levels[ii].idx_begin = previous_idx;

				// round size to nearest superior multiple of 64, makes it easier to clear a level
				_levels[ii].hash_domain =  (( (uint64_t) (_hash_domain * pow(_proba_collision,ii)) + 63) / 64 ) * 64;
				if(_levels[ii].hash_domain == 0 ) _levels[ii].hash_domain  = 64 ;
				previous_idx += _levels[ii].hash_domain;

				//printf("build level %i bit array : start %12llu, size %12llu  ",ii,_levels[ii]->idx_begin,_levels[ii]->hash_domain );
				//printf(" expected elems : %.2f %% total \n",100.0*pow(_proba_collision,ii));

			}
			
			for(int ii=0; ii<_nb_levels; ii++)
			{
				 if(pow(_proba_collision,ii) < _percent_elem_loaded_for_fastMode)
				 {
				 	_fastModeLevel = ii;
				 	 //printf("fast mode level :  %i \n",ii);
				 	break;
				 }
			}
		}